

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O2

optional<pbrt::QuadricIntersection> * __thiscall
pbrt::Disk::BasicIntersect
          (optional<pbrt::QuadricIntersection> *__return_storage_ptr__,Disk *this,Ray *r,Float tMax)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [64];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar14;
  Point3fi oi;
  Vector3fi di;
  Point3fi local_98;
  undefined1 local_78 [16];
  Interval local_68;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_30 [16];
  Interval local_20;
  undefined1 extraout_var [60];
  
  fVar1 = (r->o).super_Tuple3<pbrt::Point3,_float>.x;
  auVar6._4_4_ = fVar1;
  auVar6._0_4_ = fVar1;
  auVar6._8_4_ = fVar1;
  auVar6._12_4_ = fVar1;
  fVar1 = (r->o).super_Tuple3<pbrt::Point3,_float>.y;
  auVar10._4_4_ = fVar1;
  auVar10._0_4_ = fVar1;
  auVar10._8_4_ = fVar1;
  auVar10._12_4_ = fVar1;
  fVar1 = (r->o).super_Tuple3<pbrt::Point3,_float>.z;
  auVar12._4_4_ = fVar1;
  auVar12._0_4_ = fVar1;
  auVar12._8_4_ = fVar1;
  auVar12._12_4_ = fVar1;
  local_78 = vmovlhps_avx(auVar6,auVar10);
  local_68 = (Interval)vmovlps_avx(auVar12);
  Transform::operator()(&local_98,this->objectFromRender,(Point3fi *)local_78);
  fVar1 = (r->d).super_Tuple3<pbrt::Vector3,_float>.x;
  auVar7._4_4_ = fVar1;
  auVar7._0_4_ = fVar1;
  auVar7._8_4_ = fVar1;
  auVar7._12_4_ = fVar1;
  fVar1 = (r->d).super_Tuple3<pbrt::Vector3,_float>.y;
  auVar11._4_4_ = fVar1;
  auVar11._0_4_ = fVar1;
  auVar11._8_4_ = fVar1;
  auVar11._12_4_ = fVar1;
  fVar1 = (r->d).super_Tuple3<pbrt::Vector3,_float>.z;
  auVar13._4_4_ = fVar1;
  auVar13._0_4_ = fVar1;
  auVar13._8_4_ = fVar1;
  auVar13._12_4_ = fVar1;
  local_30 = vmovlhps_avx(auVar7,auVar11);
  local_20 = (Interval)vmovlps_avx(auVar13);
  Transform::operator()((Vector3fi *)local_78,this->objectFromRender,(Vector3fi *)local_30);
  fVar1 = (local_68.low + local_68.high) * 0.5;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    fVar2 = (local_98.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low
            + local_98.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
              high) * 0.5;
    fVar14 = (this->height - fVar2) / fVar1;
    local_48 = ZEXT416((uint)fVar14);
    if ((0.0 < fVar14) && (fVar14 < tMax)) {
      auVar5._4_4_ = local_98.super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
      auVar5._8_4_ = local_98.super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
      auVar5._0_4_ = local_98.super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
      auVar5._12_4_ =
           local_98.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
      auVar6 = vinsertps_avx(auVar5,ZEXT416((uint)local_98.super_Point3<pbrt::Interval>.
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high)
                             ,0x10);
      auVar7 = vinsertps_avx(local_78,ZEXT416((uint)local_78._12_4_),0x10);
      local_58._0_4_ =
           (local_98.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high
           + auVar6._0_4_) * 0.5 + fVar14 * (local_78._4_4_ + auVar7._0_4_) * 0.5;
      local_58._4_4_ =
           (local_98.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low +
           auVar6._4_4_) * 0.5 + fVar14 * (local_78._8_4_ + auVar7._4_4_) * 0.5;
      local_58._8_4_ = (auVar6._8_4_ + 0.0) * 0.5 + fVar14 * (auVar7._8_4_ + 0.0) * 0.5;
      local_58._12_4_ = (auVar6._12_4_ + 0.0) * 0.5 + fVar14 * (auVar7._12_4_ + 0.0) * 0.5;
      auVar8._0_4_ = local_58._0_4_ * local_58._0_4_;
      auVar8._4_4_ = local_58._4_4_ * local_58._4_4_;
      auVar8._8_4_ = local_58._8_4_ * local_58._8_4_;
      auVar8._12_4_ = local_58._12_4_ * local_58._12_4_;
      auVar6 = vhaddps_avx(auVar8,auVar8);
      if ((auVar6._0_4_ <= this->radius * this->radius) &&
         (this->innerRadius * this->innerRadius <= auVar6._0_4_)) {
        auVar6 = vmovshdup_avx(local_58);
        auVar9._0_4_ = atan2f(auVar6._0_4_,local_58._0_4_);
        auVar9._4_60_ = extraout_var;
        uVar3 = vcmpss_avx512f(auVar9._0_16_,ZEXT816(0) << 0x40,1);
        bVar4 = (bool)((byte)uVar3 & 1);
        fVar14 = (float)((uint)bVar4 * (int)(auVar9._0_4_ + 6.2831855) +
                        (uint)!bVar4 * (int)auVar9._0_4_);
        if (fVar14 <= this->phiMax) {
          __return_storage_ptr__->set = true;
          *(undefined4 *)&__return_storage_ptr__->optionalValue = local_48._0_4_;
          uVar3 = vmovlps_avx(local_58);
          *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 4) = uVar3;
          *(float *)((long)&__return_storage_ptr__->optionalValue + 0xc) =
               (float)local_48._0_4_ * fVar1 + fVar2;
          *(float *)((long)&__return_storage_ptr__->optionalValue + 0x10) = fVar14;
          return __return_storage_ptr__;
        }
      }
    }
  }
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
  *(undefined8 *)&__return_storage_ptr__->optionalValue = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<QuadricIntersection> BasicIntersect(const Ray &r, Float tMax) const {
        // Transform _Ray_ origin and direction to object space
        Point3fi oi = (*objectFromRender)(Point3fi(r.o));
        Vector3fi di = (*objectFromRender)(Vector3fi(r.d));

        // Compute plane intersection for disk
        // Reject disk intersections for rays parallel to the disk's plane
        if (Float(di.z) == 0)
            return {};

        Float tShapeHit = (height - Float(oi.z)) / Float(di.z);
        if (tShapeHit <= 0 || tShapeHit >= tMax)
            return {};

        // See if hit point is inside disk radii and $\phimax$
        Point3f pHit = Point3f(oi) + (Float)tShapeHit * Vector3f(di);
        Float dist2 = Sqr(pHit.x) + Sqr(pHit.y);
        if (dist2 > Sqr(radius) || dist2 < Sqr(innerRadius))
            return {};
        // Test disk $\phi$ value against $\phimax$
        Float phi = std::atan2(pHit.y, pHit.x);
        if (phi < 0)
            phi += 2 * Pi;
        if (phi > phiMax)
            return {};

        // Return _QuadricIntersection_ for disk intersection
        return QuadricIntersection{tShapeHit, pHit, phi};
    }